

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdcolor.c
# Opt level: O2

void rgb_rgb565_convert(j_decompress_ptr cinfo,JSAMPIMAGE input_buf,JDIMENSION input_row,
                       JSAMPARRAY output_buf,int num_rows)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  uint uVar4;
  byte *pbVar5;
  ulong uVar6;
  ushort *puVar7;
  byte *pbVar8;
  byte *pbVar9;
  long lVar10;
  uint local_3c;
  JSAMPARRAY local_38;
  
  uVar4 = cinfo->output_width;
  local_3c = input_row;
  local_38 = output_buf;
  while (0 < num_rows) {
    uVar6 = (ulong)local_3c;
    pbVar8 = (*input_buf)[uVar6];
    pbVar5 = input_buf[1][uVar6];
    pbVar9 = input_buf[2][uVar6];
    puVar7 = (ushort *)*local_38;
    if (((ulong)puVar7 & 3) != 0) {
      bVar1 = *pbVar8;
      pbVar8 = pbVar8 + 1;
      bVar2 = *pbVar5;
      pbVar5 = pbVar5 + 1;
      bVar3 = *pbVar9;
      pbVar9 = pbVar9 + 1;
      *puVar7 = (ushort)(bVar3 >> 3) | (bVar1 & 0xfff8) * 0x100 + (bVar2 & 0xfc) * 8;
      puVar7 = puVar7 + 1;
      uVar4 = uVar4 - 1;
    }
    num_rows = num_rows + -1;
    local_3c = local_3c + 1;
    local_38 = local_38 + 1;
    for (lVar10 = 0; uVar4 >> 1 != (uint)lVar10; lVar10 = lVar10 + 1) {
      *(uint *)(puVar7 + lVar10 * 2) =
           ((uint)(pbVar9[lVar10 * 2 + 1] >> 3) |
           (pbVar8[lVar10 * 2 + 1] & 0xf8) * 0x100 + (pbVar5[lVar10 * 2 + 1] & 0xfc) * 8) << 0x10 |
           (uint)(pbVar9[lVar10 * 2] >> 3) |
           (pbVar8[lVar10 * 2] & 0xf8) * 0x100 + (pbVar5[lVar10 * 2] & 0xfc) * 8;
    }
    if ((uVar4 & 1) != 0) {
      puVar7[lVar10 * 2] =
           (ushort)(pbVar9[lVar10 * 2] >> 3) |
           (pbVar8[lVar10 * 2] & 0xfff8) * 0x100 + (pbVar5[lVar10 * 2] & 0xfc) * 8;
    }
  }
  return;
}

Assistant:

METHODDEF(void)
rgb_rgb565_convert(j_decompress_ptr cinfo, JSAMPIMAGE input_buf,
                   JDIMENSION input_row, JSAMPARRAY output_buf, int num_rows)
{
  if (is_big_endian())
    rgb_rgb565_convert_be(cinfo, input_buf, input_row, output_buf, num_rows);
  else
    rgb_rgb565_convert_le(cinfo, input_buf, input_row, output_buf, num_rows);
}